

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O0

bool iDynTree::addSensorFramesAsAdditionalFramesToModel(Model *model)

{
  long *plVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  byte bVar5;
  SensorType *pSVar6;
  ulong uVar7;
  long lVar8;
  Transform *pTVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string err_1;
  bool ok_1;
  Transform link_H_sensor;
  string linkToWhichTheSensorIsAttachedName_1;
  SixAxisForceTorqueSensor *ftSensor;
  size_t sensIdx_1;
  string err;
  bool ok;
  string linkToWhichTheSensorIsAttachedName;
  LinkIndex linkToWhichTheSensorIsAttached;
  LinkSensor *linkSensor;
  size_t sensIdx;
  SensorType type;
  bool ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  undefined6 in_stack_fffffffffffffc88;
  byte in_stack_fffffffffffffc8e;
  byte in_stack_fffffffffffffc8f;
  long *local_350;
  long *local_318;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  Transform local_2a0 [103];
  byte local_239;
  string local_238 [39];
  byte local_211;
  Transform local_210 [96];
  string local_1b0 [32];
  string local_190 [32];
  long *local_170;
  ulong local_168;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  undefined1 local_100 [96];
  string local_a0 [35];
  byte local_7d;
  string local_70 [32];
  string local_50 [32];
  undefined8 local_30;
  long *local_28;
  ulong local_20;
  SensorType local_18;
  byte local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 1;
  local_18 = SIX_AXIS_FORCE_TORQUE;
  local_10 = in_RDI;
  do {
    if (4 < (int)local_18) {
      return (bool)(local_11 & 1);
    }
    bVar4 = isLinkSensor(local_18);
    if (bVar4) {
      local_20 = 0;
      while( true ) {
        uVar2 = local_20;
        pSVar6 = (SensorType *)iDynTree::Model::sensors();
        uVar7 = iDynTree::SensorsList::getNrOfSensors(pSVar6);
        if (uVar7 <= uVar2) break;
        pSVar6 = (SensorType *)iDynTree::Model::sensors();
        lVar8 = iDynTree::SensorsList::getSensor(pSVar6,(long)&local_18);
        if (lVar8 == 0) {
          local_318 = (long *)0x0;
        }
        else {
          local_318 = (long *)__dynamic_cast(lVar8,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
        }
        local_28 = local_318;
        if (local_318 == (long *)0x0) {
          return false;
        }
        local_30 = (**(code **)(*local_318 + 0x50))();
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_50);
        pbVar3 = local_10;
        (**(code **)(*local_28 + 0x10))(local_70);
        bVar5 = iDynTree::Model::isFrameNameUsed(pbVar3,local_70);
        std::__cxx11::string::~string(local_70);
        pbVar3 = local_10;
        if (((bVar5 ^ 0xff) & 1) != 0) {
          (**(code **)(*local_28 + 0x10))(local_a0);
          (**(code **)(*local_28 + 0x58))(local_100);
          bVar5 = iDynTree::Model::addAdditionalFrameToLink(pbVar3,local_50,local_a0,local_100);
          std::__cxx11::string::~string(local_a0);
          local_7d = bVar5 & 1;
          if (local_7d == 0) {
            (**(code **)(*local_28 + 0x10))(local_160);
            std::operator+((char *)CONCAT17(in_stack_fffffffffffffc8f,
                                            CONCAT16(in_stack_fffffffffffffc8e,
                                                     in_stack_fffffffffffffc88)),
                           in_stack_fffffffffffffc80);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)),
                           (char *)in_stack_fffffffffffffc80);
            std::__cxx11::string::~string(local_140);
            std::__cxx11::string::~string(local_160);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError("","addSensorFramesAsAdditionalFramesToModel",pcVar10);
            local_11 = 0;
            std::__cxx11::string::~string(local_120);
          }
        }
        std::__cxx11::string::~string(local_50);
        local_20 = local_20 + 1;
      }
    }
    if (local_18 == SIX_AXIS_FORCE_TORQUE) {
      local_168 = 0;
      while( true ) {
        uVar2 = local_168;
        pSVar6 = (SensorType *)iDynTree::Model::sensors();
        uVar7 = iDynTree::SensorsList::getNrOfSensors(pSVar6);
        if (uVar7 <= uVar2) break;
        pSVar6 = (SensorType *)iDynTree::Model::sensors();
        lVar8 = iDynTree::SensorsList::getSensor(pSVar6,(long)&local_18);
        if (lVar8 == 0) {
          local_350 = (long *)0x0;
        }
        else {
          local_350 = (long *)__dynamic_cast(lVar8,&Sensor::typeinfo,
                                             &SixAxisForceTorqueSensor::typeinfo,0);
        }
        local_170 = local_350;
        iDynTree::SixAxisForceTorqueSensor::getSecondLinkName_abi_cxx11_();
        pbVar3 = local_10;
        (**(code **)(*local_170 + 0x10))(local_1b0);
        bVar5 = iDynTree::Model::isFrameNameUsed(pbVar3,local_1b0);
        std::__cxx11::string::~string(local_1b0);
        if (((bVar5 ^ 0xff) & 1) != 0) {
          iDynTree::Transform::Transform(local_210);
          plVar1 = local_170;
          pTVar9 = (Transform *)iDynTree::SixAxisForceTorqueSensor::getSecondLinkIndex();
          in_stack_fffffffffffffc8f =
               iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform((long)plVar1,pTVar9);
          local_211 = in_stack_fffffffffffffc8f & 1;
          local_239 = 0;
          in_stack_fffffffffffffc8e = 0;
          if (local_211 != 0) {
            in_stack_fffffffffffffc80 = local_10;
            (**(code **)(*local_170 + 0x10))(local_238);
            local_239 = 1;
            iDynTree::Transform::Transform(local_2a0,local_210);
            in_stack_fffffffffffffc8e =
                 iDynTree::Model::addAdditionalFrameToLink
                           (in_stack_fffffffffffffc80,local_190,local_238,local_2a0);
          }
          local_211 = in_stack_fffffffffffffc8e & 1;
          if ((local_239 & 1) != 0) {
            std::__cxx11::string::~string(local_238);
          }
          if ((local_211 & 1) == 0) {
            (**(code **)(*local_170 + 0x10))(local_300);
            std::operator+((char *)CONCAT17(in_stack_fffffffffffffc8f,
                                            CONCAT16(in_stack_fffffffffffffc8e,
                                                     in_stack_fffffffffffffc88)),
                           in_stack_fffffffffffffc80);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)),
                           (char *)in_stack_fffffffffffffc80);
            std::__cxx11::string::~string(local_2e0);
            std::__cxx11::string::~string(local_300);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError("","addSensorFramesAsAdditionalFramesToModel",pcVar10);
            local_11 = 0;
            std::__cxx11::string::~string(local_2c0);
          }
        }
        std::__cxx11::string::~string(local_190);
        local_168 = local_168 + 1;
      }
    }
    local_18 = local_18 + ACCELEROMETER;
  } while( true );
}

Assistant:

bool addSensorFramesAsAdditionalFramesToModel(Model& model)
    {
        bool ret = true;

        // First, we cycle on all the sensor that are attached to a link, because their frame is easy to add
        // TODO : not super happy about this cycle, but is doing is work well
        for (SensorType type = SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type + 1))
        {
            // TODO : link sensor are extremly widespared and they have all approximatly the same API,
            //        so we need a better way to iterate over them
            if (isLinkSensor(type))
            {
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(model.sensors().getSensor(type,sensIdx));
                    if (!linkSensor) {
                        //TODO: error
                        return false;
                    }

                    LinkIndex linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();
                    std::string linkToWhichTheSensorIsAttachedName = model.getLinkName(linkToWhichTheSensorIsAttached);

                    if (!model.isFrameNameUsed(linkSensor->getName()))
                    {
                        // std::cerr << "Adding sensor " << linkSensor->getName() << " to link " << linkToWhichTheSensorIsAttachedName << " as additional frame"<< std::endl;
                        bool ok = model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,linkSensor->getName(),linkSensor->getLinkSensorTransform());

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + linkSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }

            // Explictly address the case of F/T sensors
            if (type == SIX_AXIS_FORCE_TORQUE)
            {
                // We add the sensor frame as an additional frame of the **child** link
                // (as tipically for URDF sensors the child link frame is coincident with the F/T sensor frame
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    SixAxisForceTorqueSensor * ftSensor = dynamic_cast<SixAxisForceTorqueSensor*>(model.sensors().getSensor(type,sensIdx));

                    std::string linkToWhichTheSensorIsAttachedName = ftSensor->getSecondLinkName();

                    if (!model.isFrameNameUsed(ftSensor->getName()))
                    {
                        Transform link_H_sensor;
                        bool ok = ftSensor->getLinkSensorTransform(ftSensor->getSecondLinkIndex(),link_H_sensor);
                        ok = ok && model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,ftSensor->getName(),link_H_sensor);

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + ftSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }
        }

        return ret;
    }